

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O3

void print<vm::Instruction>(ostream *out,Instruction *t)

{
  char cVar1;
  char *__s;
  const_iterator cVar2;
  const_iterator cVar3;
  size_t sVar4;
  long lVar5;
  Instruction *pIVar6;
  char *pcVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  char *name;
  undefined8 uStack_60;
  ostream *poStack_58;
  char *local_20;
  
  pIVar6 = t;
  cVar2 = std::
          _Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_const_char_*>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_const_char_*>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)vm::nameOfOpCode,&t->op);
  if (cVar2.super__Node_iterator_base<std::pair<const_vm::OpCode,_const_char_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    pcVar8 = "_Map_base::at";
    auVar9 = std::__throw_out_of_range("_Map_base::at");
    uStack_60 = auVar9._0_8_;
    pcVar7 = (char *)((long)&pIVar6->x + 2);
    poStack_58 = out;
    do {
      cVar1 = pcVar7[-6];
      if (cVar1 == '{') {
        if (pcVar7[-5] == '}') {
          __s = (char *)*auVar9._8_8_;
          if (__s == (char *)0x0) {
            std::ios::clear((int)pcVar8 + (int)*(undefined8 *)(*(long *)pcVar8 + -0x18));
          }
          else {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar8,__s,sVar4);
          }
          do {
            cVar1 = pcVar7[-4];
            if (cVar1 == '{') {
              if (pcVar7[-3] == '}') {
                std::ostream::_M_insert<unsigned_long>((ulong)pcVar8);
                do {
                  cVar1 = pcVar7[-2];
                  if (cVar1 == '{') {
                    if (pcVar7[-1] == '}') {
                      std::ostream::_M_insert<unsigned_long>((ulong)pcVar8);
                      sVar4 = strlen(pcVar7);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pcVar8,pcVar7,sVar4);
                      return;
                    }
                  }
                  else if (cVar1 == '\0') {
                    return;
                  }
                  uStack_60._0_6_ = CONCAT15(cVar1,(undefined5)uStack_60);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pcVar8,(char *)((long)&uStack_60 + 5),1);
                  pcVar7 = pcVar7 + 1;
                } while( true );
              }
            }
            else if (cVar1 == '\0') {
              return;
            }
            uStack_60._0_7_ = CONCAT16(cVar1,(undefined6)uStack_60);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar8,(char *)((long)&uStack_60 + 6),1);
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
      }
      else if (cVar1 == '\0') {
        return;
      }
      uStack_60 = CONCAT17(cVar1,(undefined7)uStack_60);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar8,(char *)((long)&uStack_60 + 7),1);
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  pcVar7 = *(char **)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_vm::OpCode,_const_char_*>,_false>
                            ._M_cur + 0x10);
  local_20 = pcVar7;
  cVar3 = std::
          _Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)vm::paramSizeOfOpCode,&t->op);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    lVar5 = *(long *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
                            ._M_cur + 0x18) -
            *(long *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
                            ._M_cur + 0x10) >> 2;
    if (lVar5 == 2) {
      printfmt<char_const*,unsigned_int,unsigned_int>(out,"{} {},{}",&local_20,&t->x,&t->y);
      return;
    }
    if (lVar5 == 1) {
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      }
      else {
        sVar4 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      return;
    }
    if (lVar5 != 0) {
      pcVar7 = "????";
      sVar4 = 4;
      goto LAB_00116487;
    }
  }
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    return;
  }
  sVar4 = strlen(pcVar7);
LAB_00116487:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,sVar4);
  return;
}

Assistant:

inline void print(std::ostream& out, const vm::Instruction& t) {
    const char* name = vm::nameOfOpCode.at(t.op); 
    if (auto it = vm::paramSizeOfOpCode.find(t.op); it != vm::paramSizeOfOpCode.end()) {
        switch (it->second.size()) {
        case 0: print(out, name); break;
        case 1: print(out, name, t.x); break;
        case 2: printfmt(out, "{} {},{}", name, t.x, t.y); break;
        default: print(out, "????"); break;
        }
    }
    else {
        print(out, name);
    }
}